

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_6::ReportReflectionUsageTypeError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,CppType expected_type)

{
  CppType CVar1;
  LogMessage *pLVar2;
  string_view sVar3;
  LogMessage local_38;
  Voidify local_25;
  CppType local_24;
  char *pcStack_20;
  CppType expected_type_local;
  char *method_local;
  FieldDescriptor *field_local;
  Descriptor *descriptor_local;
  
  local_24 = expected_type;
  pcStack_20 = method;
  method_local = (char *)field;
  field_local = (FieldDescriptor *)descriptor;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xf5);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [87])
                             "Protocol Buffer reflection usage error:\n  Method      : google::protobuf::Reflection::"
                     );
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar2,&stack0xffffffffffffffe0);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [18])"\n  Message type: ");
  sVar3 = Descriptor::full_name((Descriptor *)field_local);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [18])"\n  Field       : ");
  sVar3 = FieldDescriptor::full_name((FieldDescriptor *)method_local);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [80])
                             "\n  Problem     : Field is not the right type for this message:\n    Expected  : "
                     );
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar2,(char **)(protobuf::(anonymous_namespace)::cpptype_names_ +
                                      (ulong)local_24 * 8));
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [18])"\n    Field type: ");
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)method_local);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar2,(char **)(protobuf::(anonymous_namespace)::cpptype_names_ +
                                      (ulong)CVar1 * 8));
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_25,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

static void ReportReflectionUsageTypeError(
    const Descriptor* descriptor, const FieldDescriptor* field,
    const char* method, FieldDescriptor::CppType expected_type) {
  ABSL_LOG(FATAL)
      << "Protocol Buffer reflection usage error:\n"
         "  Method      : google::protobuf::Reflection::"
      << method
      << "\n"
         "  Message type: "
      << descriptor->full_name()
      << "\n"
         "  Field       : "
      << field->full_name()
      << "\n"
         "  Problem     : Field is not the right type for this message:\n"
         "    Expected  : "
      << cpptype_names_[expected_type]
      << "\n"
         "    Field type: "
      << cpptype_names_[field->cpp_type()];
}